

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_gzip.c
# Opt level: O1

int gzip_filter_close(archive_read_filter *self)

{
  z_streamp strm;
  int iVar1;
  int iVar2;
  
  strm = (z_streamp)self->data;
  iVar2 = 0;
  if (*(char *)&strm[1].next_in != '\0') {
    iVar1 = cm_zlib_inflateEnd(strm);
    iVar2 = 0;
    if (iVar1 != 0) {
      archive_set_error(&self->archive->archive,-1,"Failed to clean up gzip compressor");
      iVar2 = -0x1e;
    }
  }
  free(*(void **)&strm[1].avail_in);
  free(strm);
  return iVar2;
}

Assistant:

static int
gzip_filter_close(struct archive_read_filter *self)
{
	struct private_data *state;
	int ret;

	state = (struct private_data *)self->data;
	ret = ARCHIVE_OK;

	if (state->in_stream) {
		switch (inflateEnd(&(state->stream))) {
		case Z_OK:
			break;
		default:
			archive_set_error(&(self->archive->archive),
			    ARCHIVE_ERRNO_MISC,
			    "Failed to clean up gzip compressor");
			ret = ARCHIVE_FATAL;
		}
	}

	free(state->out_block);
	free(state);
	return (ret);
}